

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

int64_t __thiscall absl::lts_20250127::ToInt64Milliseconds(lts_20250127 *this,Duration d)

{
  int64_t iVar1;
  Duration lhs;
  
  lhs.rep_lo_ = d.rep_hi_.lo_;
  if ((ulong)this >> 0x35 == 0) {
    return ((ulong)d.rep_hi_ & 0xffffffff) / 4000000 + (long)this * 1000;
  }
  lhs.rep_hi_ = (HiRep)this;
  iVar1 = operator/(lhs,(Duration)(ZEXT412(4000000) << 0x40));
  return iVar1;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION inline int64_t ToInt64Milliseconds(Duration d) {
  if (time_internal::GetRepHi(d) >= 0 &&
      time_internal::GetRepHi(d) >> 53 == 0) {
    return (time_internal::GetRepHi(d) * 1000) +
           (time_internal::GetRepLo(d) /
            (time_internal::kTicksPerNanosecond * 1000 * 1000));
  }
  return d / Milliseconds(1);
}